

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  App *pAVar1;
  pointer pcVar2;
  OptionNotFound *pOVar3;
  App_p *subcomptr;
  pointer psVar4;
  string local_60;
  string local_40;
  
  if (subcom == (App *)0x0) {
    pOVar3 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nullptr passed","");
    OptionNotFound::OptionNotFound(pOVar3,&local_40);
    __cxa_throw(pOVar3,&OptionNotFound::typeinfo,Error::~Error);
  }
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar4 == (this->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pOVar3 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      pcVar2 = (subcom->name_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar2,pcVar2 + (subcom->name_)._M_string_length);
      OptionNotFound::OptionNotFound(pOVar3,&local_60);
      __cxa_throw(pOVar3,&OptionNotFound::typeinfo,Error::~Error);
    }
    pAVar1 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (pAVar1 == subcom) break;
    psVar4 = psVar4 + 1;
  }
  return pAVar1;
}

Assistant:

CLI11_INLINE App *App::get_subcommand(const App *subcom) const {
    if(subcom == nullptr)
        throw OptionNotFound("nullptr passed");
    for(const App_p &subcomptr : subcommands_)
        if(subcomptr.get() == subcom)
            return subcomptr.get();
    throw OptionNotFound(subcom->get_name());
}